

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

pointer __thiscall
absl::InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::data
          (InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
           *this)

{
  bool bVar1;
  undefined8 local_30;
  InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
  *this_local;
  
  bVar1 = allocated(this);
  if (bVar1) {
    local_30 = allocated_space(this);
  }
  else {
    local_30 = inlined_space(this);
  }
  return local_30;
}

Assistant:

pointer data() noexcept {
    return allocated() ? allocated_space() : inlined_space();
  }